

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisDecoderDecodeFull
          (ZydisDecoder *decoder,void *buffer,ZyanUSize length,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands,ZyanU8 operand_count,ZydisDecodingFlags flags)

{
  byte bVar1;
  ZyanStatus ZVar2;
  ZydisDecoderContext local_40;
  
  ZVar2 = 0x80100004;
  if ((instruction != (ZydisDecodedInstruction *)0x0 && length != 0) &&
      (buffer != (void *)0x0 && decoder != (ZydisDecoder *)0x0)) {
    if (((operand_count < 0xb) && (operands != (ZydisDecodedOperand *)0x0 || operand_count == '\0'))
       && (ZVar2 = 0x8010000d, decoder->decoder_mode[0] == '\0')) {
      ZVar2 = ZydisDecoderDecodeInstruction(decoder,&local_40,buffer,length,instruction);
      if (-1 < (int)ZVar2) {
        bVar1 = *(byte *)((long)(instruction->raw).prefixes + ((ulong)(flags & 1) - 0x5c));
        if (bVar1 <= operand_count) {
          operand_count = bVar1;
        }
        if (operand_count == 0) {
          ZVar2 = 0x100000;
        }
        else {
          ZVar2 = ZydisDecoderDecodeOperands(decoder,&local_40,instruction,operands,operand_count);
        }
      }
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisDecoderDecodeFull(const ZydisDecoder* decoder,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operands, ZyanU8 operand_count, ZydisDecodingFlags flags)
{
    if (!decoder || !buffer || !length || !instruction || (operand_count && !operands) ||
        (operand_count > ZYDIS_MAX_OPERAND_COUNT))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (decoder->decoder_mode[ZYDIS_DECODER_MODE_MINIMAL])
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    ZydisDecoderContext context;
    ZYAN_CHECK(ZydisDecoderDecodeInstruction(decoder, &context, buffer, length, instruction));

    const ZyanBool visible_only = flags & ZYDIS_DFLAG_VISIBLE_OPERANDS_ONLY;
    const ZyanU8 count = visible_only
        ? instruction->operand_count_visible
        : instruction->operand_count;

    operand_count = ZYAN_MIN(operand_count, count);
    if (!operand_count)
    {
        return ZYAN_STATUS_SUCCESS;
    }

    return ZydisDecoderDecodeOperands(decoder, &context, instruction, operands, operand_count);
}